

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

bool jessilib::is_valid<std::basic_string_view<char16_t,std::char_traits<char16_t>>>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> *in_string)

{
  char16_t *in_RDX;
  jessilib *this;
  char16_t *pcVar1;
  decode_result dVar2;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  
  pcVar1 = in_string->_M_str;
  for (this = (jessilib *)in_string->_M_len; this != (jessilib *)0x0; this = this + -(long)in_RDX) {
    in_string_00._M_str = in_RDX;
    in_string_00._M_len = (size_t)pcVar1;
    dVar2 = decode_codepoint_utf16<char16_t>(this,in_string_00);
    in_RDX = (char16_t *)dVar2.units;
    if (in_RDX == (char16_t *)0x0) break;
    pcVar1 = pcVar1 + (long)in_RDX;
  }
  return this == (jessilib *)0x0;
}

Assistant:

bool is_valid(const InT& in_string) {
	using InCharT = typename impl_unicode::is_string<InT>::type;
	using InViewT = std::basic_string_view<InCharT>;

	InViewT in_string_view = static_cast<InViewT>(in_string);
	while (!in_string_view.empty()) {
		decode_result string_front = decode_codepoint(in_string_view);
		if (string_front.units == 0) {
			return false;
		}
		in_string_view.remove_prefix(string_front.units);
	}

	return true;
}